

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> __thiscall
llvm::WritableMemoryBuffer::getNewMemBuffer
          (WritableMemoryBuffer *this,size_t Size,Twine *BufferName)

{
  _func_int **local_20;
  
  getNewUninitMemBuffer((WritableMemoryBuffer *)&local_20,Size,BufferName);
  if (local_20 == (_func_int **)0x0) {
    local_20 = (_func_int **)0x0;
  }
  else {
    memset(local_20[1],0,Size);
  }
  (this->super_MemoryBuffer)._vptr_MemoryBuffer = local_20;
  return (__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
          )(__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<WritableMemoryBuffer>
WritableMemoryBuffer::getNewMemBuffer(size_t Size, const Twine &BufferName) {
  auto SB = WritableMemoryBuffer::getNewUninitMemBuffer(Size, BufferName);
  if (!SB)
    return nullptr;
  memset(SB->getBufferStart(), 0, Size);
  return SB;
}